

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_cache.cpp
# Opt level: O0

void multikey_cache<8u,true>(Cacheblock<8U>_conflict *cache,size_t N,size_t depth)

{
  Cacheblock<8U>_conflict *pCVar1;
  Cacheblock<8U>_conflict *pCVar2;
  Cacheblock<8U>_conflict *pCVar3;
  unsigned_long *puVar4;
  size_t size2;
  size_t size1;
  size_t num_gt;
  size_t num_lt;
  size_t num_eq;
  size_t num_eq_end;
  size_t num_eq_beg;
  Cmp local_6d;
  int res_1;
  long lStack_68;
  int res;
  size_t end_ins;
  size_t beg_ins;
  size_t last;
  size_t first;
  Cacheblock<8U>_conflict partval;
  size_t depth_local;
  size_t N_local;
  Cacheblock<8U>_conflict *cache_local;
  
  if (N < 0x20) {
    if (N != 0) {
      insertion_sort<8u>(cache,(int)N,depth);
    }
  }
  else {
    fill_cache<8u>(cache,N,depth);
    pCVar1 = med3char<Cacheblock<8u>,Cmp>(cache,cache + (N >> 3),cache + (N >> 2));
    pCVar2 = med3char<Cacheblock<8u>,Cmp>
                       (cache + ((N >> 1) - (N >> 3)),cache + (N >> 1),cache + (N >> 1) + (N >> 3));
    pCVar3 = med3char<Cacheblock<8u>,Cmp>
                       (cache + ((N - 1) - (N >> 2)),cache + ((N - 1) - (N >> 3)),cache + (N - 3));
    pCVar1 = med3char<Cacheblock<8u>,Cmp>(pCVar1,pCVar2,pCVar3);
    std::swap<Cacheblock<8u>>(cache,pCVar1);
    first = cache->cached_bytes;
    partval.cached_bytes = (uint64_t)cache->ptr;
    last = 1;
    beg_ins = N - 1;
    end_ins = 1;
    lStack_68 = N - 1;
    while( true ) {
      while ((last <= beg_ins &&
             (res_1 = Cmp::operator()(&local_6d,cache + last,(Cacheblock<8U>_conflict *)&first),
             res_1 < 1))) {
        if (res_1 == 0) {
          pCVar1 = cache + end_ins;
          end_ins = end_ins + 1;
          std::swap<Cacheblock<8u>>(pCVar1,cache + last);
        }
        last = last + 1;
      }
      while ((last <= beg_ins &&
             (num_eq_beg._4_4_ =
                   Cmp::operator()((Cmp *)((long)&num_eq_beg + 3),cache + beg_ins,
                                   (Cacheblock<8U>_conflict *)&first), -1 < num_eq_beg._4_4_))) {
        if (num_eq_beg._4_4_ == 0) {
          pCVar1 = cache + lStack_68;
          lStack_68 = lStack_68 + -1;
          std::swap<Cacheblock<8u>>(pCVar1,cache + beg_ins);
        }
        beg_ins = beg_ins - 1;
      }
      if (beg_ins < last) break;
      std::swap<Cacheblock<8u>>(cache + last,cache + beg_ins);
      last = last + 1;
      beg_ins = beg_ins - 1;
    }
    num_eq_end = end_ins;
    num_eq = (N - 1) - lStack_68;
    num_lt = end_ins + num_eq;
    num_gt = last - end_ins;
    size1 = lStack_68 - beg_ins;
    puVar4 = std::min<unsigned_long>(&num_eq_end,&num_gt);
    std::swap_ranges<Cacheblock<8u>*,Cacheblock<8u>*>
              (cache,cache + *puVar4,cache + (last - *puVar4));
    puVar4 = std::min<unsigned_long>(&num_eq,&size1);
    std::swap_ranges<Cacheblock<8u>*,Cacheblock<8u>*>
              (cache + last,cache + last + *puVar4,cache + (N - *puVar4));
    multikey_cache<8u,false>(cache,num_gt,depth);
    multikey_cache<8u,false>(cache + num_gt + num_lt,size1,depth);
    if ((first & 0xff) != 0) {
      multikey_cache<8u,true>(cache + num_gt,num_lt,depth + 8);
    }
  }
  return;
}

Assistant:

static void
multikey_cache(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	if (N < 32) {
		if (N==0) return;
		if (CacheDirty) {
			insertion_sort(cache, N, depth);
			return;
		}
		inssort_cache_block(cache, N);
		size_t start=0, cnt=1;
		for (size_t i=0; i < N-1; ++i) {
			if (Cmp()(cache[i], cache[i+1]) == 0) {
				++cnt;
				continue;
			}
			if (cnt > 1 and cache[start].cached_bytes & 0xFF)
				insertion_sort(cache+start, cnt,
						depth+CachedChars);
			cnt = 1;
			start = i+1;
		}
		if (cnt > 1 and cache[start].cached_bytes & 0xFF)
			insertion_sort(cache+start, cnt, depth+CachedChars);
		return;
	}
	if (CacheDirty) {
		fill_cache(cache, N, depth);
	}
	// Move pivot to first position to avoid wrapping the unsigned values
	// we are using in the main loop from zero to max.
	std::swap(cache[0], med3char(
		med3char(cache[0],       cache[N/8],     cache[N/4],    Cmp()),
		med3char(cache[N/2-N/8], cache[N/2],     cache[N/2+N/8],Cmp()),
		med3char(cache[N-1-N/4], cache[N-1-N/8], cache[N-3],    Cmp()),
		Cmp()));
	Cacheblock<CachedChars> partval = cache[0];
	size_t first   = 1;
	size_t last    = N-1;
	size_t beg_ins = 1;
	size_t end_ins = N-1;
	while (true) {
		while (first <= last) {
			const int res = Cmp()(cache[first], partval);
			if (res > 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[beg_ins++], cache[first]);
			}
			++first;
		}
		while (first <= last) {
			const int res = Cmp()(cache[last], partval);
			if (res < 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[end_ins--], cache[last]);
			}
			--last;
		}
		if (first > last)
			break;
		std::swap(cache[first], cache[last]);
		++first;
		--last;
	}
	// Some calculations to make the code more readable.
	const size_t num_eq_beg = beg_ins;
	const size_t num_eq_end = N-1-end_ins;
	const size_t num_eq     = num_eq_beg+num_eq_end;
	const size_t num_lt     = first-beg_ins;
	const size_t num_gt     = end_ins-last;
	// Swap the equal pointers from the beginning to proper position.
	const size_t size1 = std::min(num_eq_beg, num_lt);
	std::swap_ranges(cache, cache+size1, cache+first-size1);
	// Swap the equal pointers from the end to proper position.
	const size_t size2 = std::min(num_eq_end, num_gt);
	std::swap_ranges(cache+first, cache+first+size2, cache+N-size2);
	// Now recurse.
	multikey_cache<CachedChars, false>(cache, num_lt, depth);
	multikey_cache<CachedChars, false>(cache+num_lt+num_eq, num_gt, depth);
	if (partval.cached_bytes & 0xFF)
		multikey_cache<CachedChars, true>(
			cache+num_lt, num_eq, depth+CachedChars);
}